

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_spec.c
# Opt level: O0

void test_delimiters_11(void)

{
  char *in_stack_00000590;
  char *in_stack_00000598;
  char *in_stack_000005a0;
  char *in_stack_000005a8;
  char *in_stack_000005b0;
  
  run(in_stack_000005b0,in_stack_000005a8,in_stack_000005a0,in_stack_00000598,in_stack_00000590);
  return;
}

Assistant:

static void
test_delimiters_11(void)
{
    run(
        "\"\\r\\n\" should be considered a newline for standalone tags",
        "|\r\n{{= @ @ =}}\r\n|",
        "{}",
        NULL,
        "|\r\n|"
    );
}